

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFanSetDefaultMode(zes_fan_handle_t hFan)

{
  zes_pfnFanSetDefaultMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFanSetDefaultMode_t pfnSetDefaultMode;
  zes_fan_handle_t hFan_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Fan).pfnSetDefaultMode;
    if (p_Var1 == (zes_pfnFanSetDefaultMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hFan_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hFan_local._4_4_ = (*p_Var1)(hFan);
    }
  }
  else {
    hFan_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hFan_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFanSetDefaultMode(
    zes_fan_handle_t hFan                           ///< [in] Handle for the component.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFanSetDefaultMode_t pfnSetDefaultMode = [&result] {
        auto pfnSetDefaultMode = ze_lib::context->zesDdiTable.load()->Fan.pfnSetDefaultMode;
        if( nullptr == pfnSetDefaultMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetDefaultMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetDefaultMode( hFan );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetDefaultMode = ze_lib::context->zesDdiTable.load()->Fan.pfnSetDefaultMode;
    if( nullptr == pfnSetDefaultMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetDefaultMode( hFan );
    #endif
}